

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O0

Float __thiscall
pbrt::FloatCheckerboardTexture::Evaluate(FloatCheckerboardTexture *this,TextureEvalContext ctx)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  TextureEvalContext ctx_00;
  TextureEvalContext ctx_01;
  TextureEvalContext ctx_02;
  TextureEvalContext ctx_03;
  float *pfVar4;
  long lVar5;
  long lVar6;
  long in_RDI;
  undefined1 auVar7 [64];
  Float FVar8;
  Float FVar9;
  undefined1 auVar10 [64];
  undefined1 in_stack_00000008 [48];
  TextureMapping3DHandle *in_stack_00000038;
  TextureMapping2DHandle *in_stack_00000040;
  AAMethod in_stack_0000004c;
  TextureEvalContext in_stack_00000060;
  array<float,_2> wt;
  TextureMapping3DHandle *in_stack_fffffffffffffde8;
  TextureMapping3DHandle *in_stack_fffffffffffffdf0;
  undefined1 auVar11 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar12 [40];
  undefined8 in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  undefined1 local_168 [64];
  undefined1 local_128 [64];
  undefined1 local_e8 [64];
  undefined1 local_a8 [64];
  undefined1 local_58 [64];
  array<float,_2> local_18 [2];
  float local_4;
  undefined1 extraout_var [56];
  
  auVar7._48_8_ = in_stack_00000038;
  auVar7._0_48_ = in_stack_00000008;
  auVar7._56_8_ = in_stack_00000040;
  auVar7 = vmovdqu64_avx512f(auVar7);
  local_58 = vmovdqu64_avx512f(auVar7);
  TextureMapping2DHandle::TextureMapping2DHandle
            ((TextureMapping2DHandle *)in_stack_fffffffffffffdf0,
             (TextureMapping2DHandle *)in_stack_fffffffffffffde8);
  TextureMapping3DHandle::TextureMapping3DHandle
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  auVar7 = vmovdqu64_avx512f(local_58);
  vmovdqu64_avx512f(auVar7);
  auVar10._0_8_ =
       Checkerboard(in_stack_0000004c,in_stack_00000060,in_stack_00000040,in_stack_00000038);
  auVar10._8_56_ = extraout_var;
  local_18[0].values = (float  [2])vmovlpd_avx(auVar10._0_16_);
  pfVar4 = pstd::array<float,_2>::operator[](local_18,0);
  if ((*pfVar4 != 0.0) || (NAN(*pfVar4))) {
    pfVar4 = pstd::array<float,_2>::operator[](local_18,1);
    if ((*pfVar4 != 0.0) || (NAN(*pfVar4))) {
      pfVar4 = pstd::array<float,_2>::operator[](local_18,0);
      fVar1 = *pfVar4;
      lVar5 = in_RDI + 0x10;
      memcpy(local_128,&stack0x00000008,0x40);
      auVar7 = vmovdqu64_avx512f(local_128);
      auVar7 = vmovdqu64_avx512f(auVar7);
      auVar12 = auVar7._24_40_;
      ctx_02.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)in_stack_fffffffffffffe28;
      ctx_02.dudx = (Float)(int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
      auVar11 = auVar12._0_12_;
      auVar13 = auVar12._12_12_;
      auVar14 = auVar12._24_12_;
      ctx_02.p.super_Tuple3<pbrt::Point3,_float>.x = (float)auVar11._0_4_;
      ctx_02.p.super_Tuple3<pbrt::Point3,_float>.y = (float)auVar11._4_4_;
      ctx_02.p.super_Tuple3<pbrt::Point3,_float>.z = (float)auVar11._8_4_;
      ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar13._0_4_;
      ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar13._4_4_;
      ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar13._8_4_;
      ctx_02.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar14._0_4_;
      ctx_02.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar14._4_4_;
      ctx_02.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar14._8_4_;
      ctx_02.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)auVar12._36_4_;
      ctx_02.dudy = (Float)(int)lVar5;
      ctx_02.dvdx = (Float)(int)((ulong)lVar5 >> 0x20);
      ctx_02.dvdy = (Float)(int)in_stack_fffffffffffffe38;
      ctx_02.faceIndex = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
      FVar8 = FloatTextureHandle::Evaluate(auVar7._8_8_,ctx_02);
      pfVar4 = pstd::array<float,_2>::operator[](local_18,1);
      fVar2 = *pfVar4;
      lVar6 = in_RDI + 0x18;
      memcpy(local_168,&stack0x00000008,0x40);
      auVar7 = vmovdqu64_avx512f(local_168);
      auVar7 = vmovdqu64_avx512f(auVar7);
      auVar12 = auVar7._24_40_;
      ctx_03.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)in_stack_fffffffffffffe28;
      ctx_03.dudx = (Float)(int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
      auVar11 = auVar12._0_12_;
      auVar13 = auVar12._12_12_;
      auVar14 = auVar12._24_12_;
      ctx_03.p.super_Tuple3<pbrt::Point3,_float>.x = (float)auVar11._0_4_;
      ctx_03.p.super_Tuple3<pbrt::Point3,_float>.y = (float)auVar11._4_4_;
      ctx_03.p.super_Tuple3<pbrt::Point3,_float>.z = (float)auVar11._8_4_;
      ctx_03.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar13._0_4_;
      ctx_03.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar13._4_4_;
      ctx_03.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar13._8_4_;
      ctx_03.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar14._0_4_;
      ctx_03.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar14._4_4_;
      ctx_03.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar14._8_4_;
      ctx_03.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)auVar12._36_4_;
      ctx_03.dudy = (Float)(int)lVar5;
      ctx_03.dvdx = (Float)(int)((ulong)lVar5 >> 0x20);
      ctx_03.dvdy = (Float)(int)lVar6;
      ctx_03.faceIndex = (int)((ulong)lVar6 >> 0x20);
      FVar9 = FloatTextureHandle::Evaluate(auVar7._8_8_,ctx_03);
      auVar3 = vfmadd213ss_fma(ZEXT416((uint)FVar8),ZEXT416((uint)fVar1),
                               ZEXT416((uint)(fVar2 * FVar9)));
      local_4 = auVar3._0_4_;
    }
    else {
      pfVar4 = pstd::array<float,_2>::operator[](local_18,0);
      fVar1 = *pfVar4;
      memcpy(local_e8,&stack0x00000008,0x40);
      auVar7 = vmovdqu64_avx512f(local_e8);
      auVar7 = vmovdqu64_avx512f(auVar7);
      auVar12 = auVar7._24_40_;
      ctx_01.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)in_stack_fffffffffffffe28;
      ctx_01.dudx = (Float)(int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
      auVar11 = auVar12._0_12_;
      auVar13 = auVar12._12_12_;
      auVar14 = auVar12._24_12_;
      ctx_01.p.super_Tuple3<pbrt::Point3,_float>.x = (float)auVar11._0_4_;
      ctx_01.p.super_Tuple3<pbrt::Point3,_float>.y = (float)auVar11._4_4_;
      ctx_01.p.super_Tuple3<pbrt::Point3,_float>.z = (float)auVar11._8_4_;
      ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar13._0_4_;
      ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar13._4_4_;
      ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar13._8_4_;
      ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar14._0_4_;
      ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar14._4_4_;
      ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar14._8_4_;
      ctx_01.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)auVar12._36_4_;
      ctx_01.dudy = (Float)(int)in_stack_fffffffffffffe30;
      ctx_01.dvdx = (Float)(int)((ulong)in_stack_fffffffffffffe30 >> 0x20);
      ctx_01.dvdy = (Float)(int)in_stack_fffffffffffffe38;
      ctx_01.faceIndex = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
      FVar8 = FloatTextureHandle::Evaluate(auVar7._8_8_,ctx_01);
      local_4 = fVar1 * FVar8;
    }
  }
  else {
    pfVar4 = pstd::array<float,_2>::operator[](local_18,1);
    fVar1 = *pfVar4;
    memcpy(local_a8,&stack0x00000008,0x40);
    auVar7 = vmovdqu64_avx512f(local_a8);
    auVar7 = vmovdqu64_avx512f(auVar7);
    auVar12 = auVar7._24_40_;
    ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)in_stack_fffffffffffffe28;
    ctx_00.dudx = (Float)(int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
    auVar11 = auVar12._0_12_;
    auVar13 = auVar12._12_12_;
    auVar14 = auVar12._24_12_;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.x = (float)auVar11._0_4_;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.y = (float)auVar11._4_4_;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.z = (float)auVar11._8_4_;
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar13._0_4_;
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar13._4_4_;
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar13._8_4_;
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar14._0_4_;
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar14._4_4_;
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar14._8_4_;
    ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)auVar12._36_4_;
    ctx_00.dudy = (Float)(int)in_stack_fffffffffffffe30;
    ctx_00.dvdx = (Float)(int)((ulong)in_stack_fffffffffffffe30 >> 0x20);
    ctx_00.dvdy = (Float)(int)in_stack_fffffffffffffe38;
    ctx_00.faceIndex = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
    FVar8 = FloatTextureHandle::Evaluate(auVar7._8_8_,ctx_00);
    local_4 = fVar1 * FVar8;
  }
  return local_4;
}

Assistant:

PBRT_CPU_GPU
    Float Evaluate(TextureEvalContext ctx) const {
        pstd::array<Float, 2> wt = Checkerboard(aaMethod, ctx, map2D, map3D);
        if (wt[0] == 0)
            return wt[1] * tex[1].Evaluate(ctx);
        else if (wt[1] == 0)
            return wt[0] * tex[0].Evaluate(ctx);
        else
            return wt[0] * tex[0].Evaluate(ctx) + wt[1] * tex[1].Evaluate(ctx);
    }